

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O1

bool google::FindSymbol(uint64_t pc,int fd,char *out,int out_size,uint64_t symbol_offset,
                       Elf64_Shdr *strtab,Elf64_Shdr *symtab)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ssize_t sVar9;
  void *pvVar10;
  byte bVar11;
  size_t count;
  long *plVar12;
  int iVar13;
  bool bVar14;
  bool bVar15;
  Elf64_Sym buf [32];
  undefined1 local_338 [16];
  long local_328 [95];
  int iVar5;
  
  if (symtab == (Elf64_Shdr *)0x0) {
LAB_00125186:
    bVar11 = 0;
  }
  else {
    uVar1 = symtab->sh_size;
    uVar2 = symtab->sh_entsize;
    count = (size_t)out_size;
    iVar13 = 0;
    do {
      iVar5 = (int)(uVar1 / uVar2);
      iVar4 = iVar5 - iVar13;
      if (iVar4 == 0 || iVar5 < iVar13) goto LAB_00125186;
      if (0x1f < iVar4) {
        iVar4 = 0x20;
      }
      uVar6 = ReadFromOffset(fd,local_338,(long)iVar4 * 0x18,
                             (long)iVar13 * symtab->sh_entsize + symtab->sh_offset);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar6;
      uVar7 = SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),0);
      if ((0xaaaaaaaaaaaaaaa < (uVar7 >> 3 | uVar7 << 0x3d)) ||
         (uVar7 = uVar6 / 0x18, (long)iVar4 < (long)uVar7)) {
        abort();
      }
      bVar14 = 0x17 < uVar6;
      if (bVar14) {
        plVar12 = local_328;
        uVar6 = 1;
        do {
          bVar15 = true;
          if ((((plVar12[-1] != 0) && (uVar8 = plVar12[-1] + symbol_offset, uVar8 <= pc)) &&
              (*(short *)((long)plVar12 + -10) != 0)) && (pc < uVar8 + *plVar12)) {
            sVar9 = ReadFromOffset(fd,out,count,(ulong)*(uint *)(plVar12 + -2) + strtab->sh_offset);
            bVar15 = false;
            if (sVar9 < 1) {
              out_size = 0;
            }
            else {
              pvVar10 = memchr(out,0,count);
              out_size = (int)(pvVar10 != (void *)0x0);
            }
          }
          if (!bVar15) break;
          bVar14 = uVar6 < uVar7;
          plVar12 = plVar12 + 3;
          bVar15 = uVar6 != uVar7;
          uVar6 = uVar6 + 1;
        } while (bVar15);
      }
      bVar11 = (byte)out_size;
      iVar5 = (int)uVar7;
      if (bVar14) {
        iVar5 = 0;
      }
      iVar13 = iVar5 + iVar13;
    } while (!bVar14);
  }
  return (bool)(bVar11 & 1);
}

Assistant:

static ATTRIBUTE_NOINLINE bool
FindSymbol(uint64_t pc, const int fd, char *out, int out_size,
           uint64_t symbol_offset, const ElfW(Shdr) *strtab,
           const ElfW(Shdr) *symtab) {
  if (symtab == NULL) {
    return false;
  }
  const int num_symbols = symtab->sh_size / symtab->sh_entsize;
  for (int i = 0; i < num_symbols;) {
    off_t offset = symtab->sh_offset + i * symtab->sh_entsize;

    // If we are reading Elf64_Sym's, we want to limit this array to
    // 32 elements (to keep stack consumption low), otherwise we can
    // have a 64 element Elf32_Sym array.
#if __WORDSIZE == 64
#define NUM_SYMBOLS 32
#else
#define NUM_SYMBOLS 64
#endif

    // Read at most NUM_SYMBOLS symbols at once to save read() calls.
    ElfW(Sym) buf[NUM_SYMBOLS];
    int num_symbols_to_read = std::min(NUM_SYMBOLS, num_symbols - i);
    const ssize_t len =
        ReadFromOffset(fd, &buf, sizeof(buf[0]) * num_symbols_to_read, offset);
    SAFE_ASSERT(len % sizeof(buf[0]) == 0);
    const ssize_t num_symbols_in_buf = len / sizeof(buf[0]);
    SAFE_ASSERT(num_symbols_in_buf <= num_symbols_to_read);
    for (int j = 0; j < num_symbols_in_buf; ++j) {
      const ElfW(Sym)& symbol = buf[j];
      uint64_t start_address = symbol.st_value;
      start_address += symbol_offset;
      uint64_t end_address = start_address + symbol.st_size;
      if (symbol.st_value != 0 &&  // Skip null value symbols.
          symbol.st_shndx != 0 &&  // Skip undefined symbols.
          start_address <= pc && pc < end_address) {
        ssize_t len1 = ReadFromOffset(fd, out, out_size,
                                      strtab->sh_offset + symbol.st_name);
        if (len1 <= 0 || memchr(out, '\0', out_size) == NULL) {
          return false;
        }
        return true;  // Obtained the symbol name.
      }
    }
    i += num_symbols_in_buf;
  }
  return false;
}